

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

unique_ptr<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>_> __thiscall
perfetto::ipc::Host::CreateInstance(Host *this,char *socket_name,TaskRunner *task_runner)

{
  bool bVar1;
  HostImpl *this_00;
  pointer pHVar2;
  UnixSocket *pUVar3;
  unique_ptr<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_> local_28;
  unique_ptr<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_> host;
  TaskRunner *task_runner_local;
  char *socket_name_local;
  
  host._M_t.
  super___uniq_ptr_impl<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_>._M_t
  .super__Tuple_impl<0UL,_perfetto::ipc::HostImpl_*,_std::default_delete<perfetto::ipc::HostImpl>_>.
  super__Head_base<0UL,_perfetto::ipc::HostImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>,_true,_true>
        )(__uniq_ptr_data<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>,_true,_true>
          )task_runner;
  this_00 = (HostImpl *)operator_new(0xd0);
  HostImpl::HostImpl(this_00,socket_name,
                     (TaskRunner *)
                     host._M_t.
                     super___uniq_ptr_impl<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_perfetto::ipc::HostImpl_*,_std::default_delete<perfetto::ipc::HostImpl>_>
                     .super__Head_base<0UL,_perfetto::ipc::HostImpl_*,_false>._M_head_impl);
  ::std::unique_ptr<perfetto::ipc::HostImpl,std::default_delete<perfetto::ipc::HostImpl>>::
  unique_ptr<std::default_delete<perfetto::ipc::HostImpl>,void>
            ((unique_ptr<perfetto::ipc::HostImpl,std::default_delete<perfetto::ipc::HostImpl>> *)
             &local_28,this_00);
  pHVar2 = std::unique_ptr<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_>::
           operator->(&local_28);
  pUVar3 = HostImpl::sock(pHVar2);
  if (pUVar3 != (UnixSocket *)0x0) {
    pHVar2 = std::unique_ptr<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_>
             ::operator->(&local_28);
    pUVar3 = HostImpl::sock(pHVar2);
    bVar1 = perfetto::base::UnixSocket::is_listening(pUVar3);
    if (bVar1) {
      ::std::unique_ptr<perfetto::ipc::Host,std::default_delete<perfetto::ipc::Host>>::
      unique_ptr<perfetto::ipc::HostImpl,std::default_delete<perfetto::ipc::HostImpl>,void>
                ((unique_ptr<perfetto::ipc::Host,std::default_delete<perfetto::ipc::Host>> *)this,
                 &local_28);
      goto LAB_006cbbef;
    }
  }
  ::std::unique_ptr<perfetto::ipc::Host,std::default_delete<perfetto::ipc::Host>>::
  unique_ptr<std::default_delete<perfetto::ipc::Host>,void>
            ((unique_ptr<perfetto::ipc::Host,std::default_delete<perfetto::ipc::Host>> *)this,
             (nullptr_t)0x0);
LAB_006cbbef:
  std::unique_ptr<perfetto::ipc::HostImpl,_std::default_delete<perfetto::ipc::HostImpl>_>::
  ~unique_ptr(&local_28);
  return (__uniq_ptr_data<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>,_true,_true>
         )(__uniq_ptr_data<perfetto::ipc::Host,_std::default_delete<perfetto::ipc::Host>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Host> Host::CreateInstance(const char* socket_name,
                                           base::TaskRunner* task_runner) {
  std::unique_ptr<HostImpl> host(new HostImpl(socket_name, task_runner));
  if (!host->sock() || !host->sock()->is_listening())
    return nullptr;
  return std::unique_ptr<Host>(std::move(host));
}